

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EnforceProtocEditionsSupport
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  FileDescriptor *this_00;
  pointer pcVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  Edition edition;
  int iVar6;
  char *extraout_RDX;
  size_t in_R9;
  pointer ppFVar7;
  pointer ppFVar8;
  bool bVar9;
  string_view filename;
  string_view format;
  char *local_d8;
  long local_d0;
  char local_c8;
  undefined7 uStack_c7;
  StringifySink local_b8;
  StringifySink local_98;
  pointer local_70;
  size_type local_68;
  pointer local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  
  bVar9 = true;
  if (this->experimental_editions_ == false) {
    ppFVar7 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppFVar8 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    bVar9 = ppFVar7 == ppFVar8;
    local_70 = ppFVar8;
    while (!bVar9) {
      this_00 = *ppFVar7;
      edition = FileDescriptor::edition(this_00);
      filename._M_str = extraout_RDX;
      filename._M_len = (size_t)(this_00->name_->_M_dataplus)._M_p;
      bVar5 = CanSkipEditionCheck((compiler *)this_00->name_->_M_string_length,filename);
      iVar6 = 3;
      if ((!bVar5) && (iVar6 = 0, 1000 < (int)edition)) {
        pcVar1 = (this_00->name_->_M_dataplus)._M_p;
        sVar2 = this_00->name_->_M_string_length;
        local_98.buffer_.field_2._8_8_ = 0;
        local_98.buffer_._M_string_length = 0;
        local_98.buffer_.field_2._M_allocated_capacity = 0;
        local_98.buffer_._M_dataplus._M_p = (pointer)&local_98.buffer_.field_2;
        AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_98,edition);
        sVar4 = local_98.buffer_._M_string_length;
        _Var3._M_p = local_98.buffer_._M_dataplus._M_p;
        local_b8.buffer_.field_2._8_8_ = 0;
        local_b8.buffer_._M_dataplus._M_p = (pointer)&local_b8.buffer_.field_2;
        local_b8.buffer_._M_string_length = 0;
        local_b8.buffer_.field_2._M_allocated_capacity = 0;
        AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_b8,EDITION_2023);
        local_d8 = &local_c8;
        local_d0 = 0;
        local_c8 = '\0';
        local_58 = sVar4;
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)_Var3._M_p;
        local_48 = local_b8.buffer_._M_string_length;
        local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_b8.buffer_._M_dataplus._M_p;
        format._M_str = (char *)&local_68;
        format._M_len =
             (size_t)
             "$0: is a file using edition $1, which is later than the protoc maximum supported edition $2."
        ;
        local_68 = sVar2;
        local_60 = pcVar1;
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)&local_d8,(Nonnull<std::string_*>)0x5c,format,
                   (Nullable<const_absl::string_view_*>)0x3,in_R9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_d8,local_d0);
        ppFVar8 = local_70;
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8.buffer_._M_dataplus._M_p != &local_b8.buffer_.field_2) {
          operator_delete(local_b8.buffer_._M_dataplus._M_p,
                          local_b8.buffer_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.buffer_._M_dataplus._M_p != &local_98.buffer_.field_2) {
          operator_delete(local_98.buffer_._M_dataplus._M_p,
                          local_98.buffer_.field_2._M_allocated_capacity + 1);
        }
        iVar6 = 1;
      }
      if ((iVar6 != 3) && (iVar6 != 0)) {
        return bVar9;
      }
      ppFVar7 = ppFVar7 + 1;
      bVar9 = ppFVar7 == ppFVar8;
    }
  }
  return bVar9;
}

Assistant:

bool CommandLineInterface::EnforceProtocEditionsSupport(
    const std::vector<const FileDescriptor*>& parsed_files) const {
  if (experimental_editions_) {
    // The user has explicitly specified the experimental flag.
    return true;
  }
  for (const auto* fd : parsed_files) {
    Edition edition =
        ::google::protobuf::internal::InternalFeatureHelper::GetEdition(*fd);
    if (CanSkipEditionCheck(fd->name())) {
      // Legacy proto2/proto3 or exempted files don't need any checks.
      continue;
    }

    if (edition > ProtocMaximumEdition()) {
      std::cerr << absl::Substitute(
          "$0: is a file using edition $1, which is later than the protoc "
          "maximum supported edition $2.",
          fd->name(), edition, ProtocMaximumEdition());
      return false;
    }
  }
  return true;
}